

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorShader::ReleaseElementData(DecoratorShader *this,DecoratorDataHandle handle)

{
  GetShaderElementDataPool();
  Pool<Rml::ShaderElementData>::DestroyAndDeallocate
            (&GetShaderElementDataPool::gradient_element_data_pool,(ShaderElementData *)handle);
  return;
}

Assistant:

void DecoratorShader::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}